

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::transpose_pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int *piVar21;
  undefined8 uVar22;
  int iVar23;
  undefined1 (*pauVar24) [16];
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  size_t *psVar29;
  long lVar30;
  undefined4 *puVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 (*pauVar36) [32];
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  
  iVar1 = B->elempack;
  psVar29 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar29 = &B->cstep;
  }
  iVar2 = (int)*psVar29;
  lVar35 = 0;
  lVar30 = (long)iVar2;
  lVar33 = (long)j;
  if (0xb < max_jj) {
    lVar35 = (long)(iVar2 * k);
    lVar32 = lVar33 * 0x20 + lVar35 * 4 + 0x160;
    lVar34 = lVar33 * 0x10 + lVar35 * 4 + 0xb0;
    lVar25 = lVar35 * 4 + lVar33 * 4 + 0x20;
    lVar28 = 0;
    do {
      if (iVar1 == 8) {
        if (7 < max_kk) {
          pauVar36 = (undefined1 (*) [32])((long)B->data + lVar32);
          iVar23 = 7;
          do {
            auVar17 = vunpcklps_avx(pauVar36[-0xb],pauVar36[-10]);
            auVar8 = vunpckhps_avx(pauVar36[-0xb],pauVar36[-10]);
            auVar47 = vunpcklps_avx(pauVar36[-9],pauVar36[-8]);
            auVar9 = vunpckhps_avx(pauVar36[-9],pauVar36[-8]);
            auVar45 = vunpcklps_avx(pauVar36[-7],pauVar36[-6]);
            auVar10 = vunpckhps_avx(pauVar36[-7],pauVar36[-6]);
            auVar18 = vunpcklps_avx(pauVar36[-5],pauVar36[-4]);
            auVar11 = vunpckhps_avx(pauVar36[-5],pauVar36[-4]);
            auVar19 = vunpcklps_avx(pauVar36[-3],pauVar36[-2]);
            auVar12 = vunpckhps_avx(pauVar36[-3],pauVar36[-2]);
            auVar20 = vunpcklps_avx(pauVar36[-1],*pauVar36);
            auVar13 = vunpckhps_avx(pauVar36[-1],*pauVar36);
            auVar14 = vunpcklpd_avx(auVar17,auVar47);
            auVar17 = vunpckhpd_avx(auVar17,auVar47);
            auVar47 = vunpcklpd_avx(auVar8,auVar9);
            auVar8 = vunpckhpd_avx(auVar8,auVar9);
            auVar43 = vunpcklpd_avx(auVar45,auVar18);
            auVar9 = vunpckhpd_avx(auVar45,auVar18);
            auVar45 = vunpcklpd_avx(auVar10,auVar11);
            auVar10 = vunpckhpd_avx(auVar10,auVar11);
            auVar18 = vunpcklpd_avx(auVar19,auVar20);
            auVar11 = vunpckhpd_avx(auVar19,auVar20);
            auVar19 = vunpcklpd_avx(auVar12,auVar13);
            auVar12 = vunpckhpd_avx(auVar12,auVar13);
            auVar39 = auVar43._0_16_;
            auVar13 = vperm2f128_avx(auVar14,auVar43,0x31);
            auVar42 = auVar18._0_16_;
            auVar38 = auVar17._0_16_;
            auVar17 = vperm2f128_avx(auVar18,auVar17,0x31);
            auVar43._16_16_ = auVar11._0_16_;
            auVar43._0_16_ = auVar9._0_16_;
            auVar9 = vperm2f128_avx(auVar9,auVar11,0x31);
            auVar46 = auVar47._0_16_;
            auVar41 = auVar45._0_16_;
            auVar11 = vperm2f128_avx(auVar47,auVar45,0x31);
            auVar47._16_16_ = auVar8._0_16_;
            auVar47._0_16_ = auVar19._0_16_;
            auVar8 = vperm2f128_avx(auVar19,auVar8,0x31);
            auVar40 = auVar10._0_16_;
            auVar44 = auVar12._0_16_;
            auVar10 = vperm2f128_avx(auVar10,auVar12,0x31);
            BT->data = (void *)SUB168(auVar14._0_16_,0);
            BT->refcount = (int *)SUB168(auVar14._0_16_,8);
            BT->elemsize = auVar39._0_8_;
            BT->elempack = auVar39._8_4_;
            *(int *)&BT->field_0x1c = auVar39._12_4_;
            BT->allocator = (Allocator *)auVar42._0_8_;
            BT->dims = auVar42._8_4_;
            BT->w = auVar42._12_4_;
            BT->h = auVar38._0_4_;
            BT->d = auVar38._4_4_;
            BT->c = auVar38._8_4_;
            *(int *)&BT->field_0x3c = auVar38._12_4_;
            *(undefined1 (*) [32])&BT->cstep = auVar43;
            BT[1].elempack = auVar46._0_4_;
            *(int *)&BT[1].field_0x1c = auVar46._4_4_;
            BT[1].allocator = (Allocator *)auVar46._8_8_;
            BT[1].dims = auVar41._0_4_;
            BT[1].w = auVar41._4_4_;
            BT[1].h = auVar41._8_4_;
            BT[1].d = auVar41._12_4_;
            *(undefined1 (*) [32])&BT[1].c = auVar47;
            BT[2].elemsize = auVar40._0_8_;
            BT[2].elempack = auVar40._8_4_;
            *(int *)&BT[2].field_0x1c = auVar40._12_4_;
            BT[2].allocator = (Allocator *)auVar44._0_8_;
            BT[2].dims = auVar44._8_4_;
            BT[2].w = auVar44._12_4_;
            *(undefined1 (*) [32])&BT[2].h = auVar13;
            BT[3].refcount = (int *)auVar17._0_8_;
            BT[3].elemsize = auVar17._8_8_;
            BT[3].elempack = auVar17._16_4_;
            *(int *)&BT[3].field_0x1c = auVar17._20_4_;
            BT[3].allocator = (Allocator *)auVar17._24_8_;
            BT[3].dims = auVar9._0_4_;
            BT[3].w = auVar9._4_4_;
            BT[3].h = auVar9._8_4_;
            BT[3].d = auVar9._12_4_;
            BT[3].c = auVar9._16_4_;
            *(int *)&BT[3].field_0x3c = auVar9._20_4_;
            BT[3].cstep = auVar9._24_8_;
            BT[4].data = (void *)auVar11._0_8_;
            BT[4].refcount = (int *)auVar11._8_8_;
            BT[4].elemsize = auVar11._16_8_;
            BT[4].elempack = auVar11._24_4_;
            *(int *)&BT[4].field_0x1c = auVar11._28_4_;
            BT[4].allocator = (Allocator *)auVar8._0_8_;
            BT[4].dims = auVar8._8_4_;
            BT[4].w = auVar8._12_4_;
            BT[4].h = auVar8._16_4_;
            BT[4].d = auVar8._20_4_;
            BT[4].c = auVar8._24_4_;
            *(int *)&BT[4].field_0x3c = auVar8._28_4_;
            *(undefined1 (*) [32])&BT[4].cstep = auVar10;
            BT = (Mat *)&BT[5].elempack;
            pauVar36 = (undefined1 (*) [32])(*pauVar36 + (long)(iVar2 * 8) * 4);
            iVar23 = iVar23 + 8;
          } while (iVar23 < max_kk);
          goto LAB_004c808a;
        }
      }
      else {
LAB_004c808a:
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004c81f8;
          pauVar24 = (undefined1 (*) [16])((long)B->data + lVar34);
          iVar23 = 3;
          do {
            auVar39 = vunpcklps_avx(pauVar24[-0xb],pauVar24[-10]);
            auVar42 = vunpcklps_avx(pauVar24[-9],pauVar24[-8]);
            auVar40 = vunpckhps_avx(pauVar24[-0xb],pauVar24[-10]);
            auVar41 = vunpckhps_avx(pauVar24[-9],pauVar24[-8]);
            auVar38 = vmovlhps_avx(auVar39,auVar42);
            auVar46 = vunpckhpd_avx(auVar39,auVar42);
            auVar39 = vmovlhps_avx(auVar40,auVar41);
            auVar4 = vunpckhpd_avx(auVar40,auVar41);
            auVar41 = vunpcklps_avx(pauVar24[-7],pauVar24[-6]);
            auVar15 = vunpcklps_avx(pauVar24[-5],pauVar24[-4]);
            auVar42 = vunpckhps_avx(pauVar24[-7],pauVar24[-6]);
            auVar44 = vunpckhps_avx(pauVar24[-5],pauVar24[-4]);
            auVar40 = vmovlhps_avx(auVar41,auVar15);
            auVar15 = vunpckhpd_avx(auVar41,auVar15);
            auVar41 = vmovlhps_avx(auVar42,auVar44);
            auVar5 = vunpckhpd_avx(auVar42,auVar44);
            auVar44 = vunpcklps_avx(pauVar24[-3],pauVar24[-2]);
            auVar16 = vunpcklps_avx(pauVar24[-1],*pauVar24);
            auVar6 = vunpckhps_avx(pauVar24[-3],pauVar24[-2]);
            auVar7 = vunpckhps_avx(pauVar24[-1],*pauVar24);
            auVar42 = vmovlhps_avx(auVar44,auVar16);
            auVar16 = vunpckhpd_avx(auVar44,auVar16);
            auVar44 = vmovlhps_avx(auVar6,auVar7);
            auVar6 = vunpckhpd_avx(auVar6,auVar7);
            BT->data = (void *)auVar38._0_8_;
            BT->refcount = (int *)auVar38._8_8_;
            BT->elemsize = auVar40._0_8_;
            BT->elempack = auVar40._8_4_;
            *(int *)&BT->field_0x1c = auVar40._12_4_;
            BT->allocator = (Allocator *)auVar42._0_8_;
            BT->dims = auVar42._8_4_;
            BT->w = auVar42._12_4_;
            BT->h = auVar46._0_4_;
            BT->d = auVar46._4_4_;
            BT->c = auVar46._8_4_;
            *(int *)&BT->field_0x3c = auVar46._12_4_;
            *(undefined1 (*) [16])&BT->cstep = auVar15;
            BT[1].refcount = (int *)auVar16._0_8_;
            BT[1].elemsize = auVar16._8_8_;
            BT[1].elempack = auVar39._0_4_;
            *(int *)&BT[1].field_0x1c = auVar39._4_4_;
            BT[1].allocator = (Allocator *)auVar39._8_8_;
            BT[1].dims = auVar41._0_4_;
            BT[1].w = auVar41._4_4_;
            BT[1].h = auVar41._8_4_;
            BT[1].d = auVar41._12_4_;
            BT[1].c = auVar44._0_4_;
            *(int *)&BT[1].field_0x3c = auVar44._4_4_;
            BT[1].cstep = auVar44._8_8_;
            BT[2].data = (void *)auVar4._0_8_;
            BT[2].refcount = (int *)auVar4._8_8_;
            BT[2].elemsize = auVar5._0_8_;
            BT[2].elempack = auVar5._8_4_;
            *(int *)&BT[2].field_0x1c = auVar5._12_4_;
            BT[2].allocator = (Allocator *)auVar6._0_8_;
            BT[2].dims = auVar6._8_4_;
            BT[2].w = auVar6._12_4_;
            BT = (Mat *)&BT[2].h;
            pauVar24 = (undefined1 (*) [16])(*pauVar24 + (long)(iVar2 * 4) * 4);
            iVar23 = iVar23 + 4;
          } while (iVar23 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar24 = (undefined1 (*) [16])((long)B->data + lVar25);
          iVar23 = max_kk;
          do {
            piVar21 = *(int **)(pauVar24[-2] + 8);
            BT->data = *(void **)pauVar24[-2];
            BT->refcount = piVar21;
            uVar22 = *(undefined8 *)(pauVar24[-1] + 8);
            BT->elemsize = *(size_t *)pauVar24[-1];
            *(undefined8 *)&BT->elempack = uVar22;
            *(undefined1 (*) [16])&BT->allocator = *pauVar24;
            BT = (Mat *)&BT->h;
            pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar30 * 4);
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
        }
      }
LAB_004c81f8:
      lVar35 = lVar28 + 0xc;
      uVar26 = lVar28 + 0x17;
      lVar32 = lVar32 + 0x180;
      lVar34 = lVar34 + 0xc0;
      lVar25 = lVar25 + 0x30;
      lVar28 = lVar35;
    } while (uVar26 < (uint)max_jj);
  }
  lVar28 = (long)max_jj;
  if ((int)lVar35 + 7 < max_jj) {
    lVar32 = (long)(iVar2 * k);
    lVar25 = (long)(int)lVar35;
    lVar37 = (lVar25 + lVar33) * 0x20 + lVar32 * 4 + 0xe0;
    lVar34 = (lVar25 + lVar33) * 0x10 + lVar32 * 4 + 0x70;
    lVar32 = lVar33 * 4 + lVar25 * 4 + lVar32 * 4 + 0x10;
    do {
      if (iVar1 == 8) {
        if (7 < max_kk) {
          pauVar36 = (undefined1 (*) [32])((long)B->data + lVar37);
          iVar23 = 7;
          do {
            auVar17 = vunpcklps_avx(pauVar36[-7],pauVar36[-6]);
            auVar8 = vunpckhps_avx(pauVar36[-7],pauVar36[-6]);
            auVar13 = vunpcklps_avx(pauVar36[-5],pauVar36[-4]);
            auVar9 = vunpckhps_avx(pauVar36[-5],pauVar36[-4]);
            auVar47 = vunpcklps_avx(pauVar36[-3],pauVar36[-2]);
            auVar10 = vunpckhps_avx(pauVar36[-3],pauVar36[-2]);
            auVar43 = vunpcklps_avx(pauVar36[-1],*pauVar36);
            auVar11 = vunpckhps_avx(pauVar36[-1],*pauVar36);
            auVar12 = vunpcklpd_avx(auVar17,auVar13);
            auVar17 = vunpckhpd_avx(auVar17,auVar13);
            auVar13 = vunpcklpd_avx(auVar8,auVar9);
            auVar8 = vunpckhpd_avx(auVar8,auVar9);
            auVar14 = vunpcklpd_avx(auVar47,auVar43);
            auVar9 = vunpckhpd_avx(auVar47,auVar43);
            auVar47 = vunpcklpd_avx(auVar10,auVar11);
            auVar10 = vunpckhpd_avx(auVar10,auVar11);
            auVar40 = auVar14._0_16_;
            auVar39 = auVar17._0_16_;
            auVar41 = auVar9._0_16_;
            auVar45._16_16_ = auVar47._0_16_;
            auVar45._0_16_ = auVar13._0_16_;
            auVar38 = auVar8._0_16_;
            auVar42 = auVar10._0_16_;
            auVar11 = vperm2f128_avx(auVar12,auVar14,0x31);
            auVar17 = vperm2f128_avx(auVar17,auVar9,0x31);
            auVar9 = vperm2f128_avx(auVar13,auVar47,0x31);
            auVar8 = vperm2f128_avx(auVar8,auVar10,0x31);
            BT->data = (void *)SUB168(auVar12._0_16_,0);
            BT->refcount = (int *)SUB168(auVar12._0_16_,8);
            BT->elemsize = auVar40._0_8_;
            BT->elempack = auVar40._8_4_;
            *(int *)&BT->field_0x1c = auVar40._12_4_;
            BT->allocator = (Allocator *)auVar39._0_8_;
            BT->dims = auVar39._8_4_;
            BT->w = auVar39._12_4_;
            BT->h = auVar41._0_4_;
            BT->d = auVar41._4_4_;
            BT->c = auVar41._8_4_;
            *(int *)&BT->field_0x3c = auVar41._12_4_;
            *(undefined1 (*) [32])&BT->cstep = auVar45;
            BT[1].elempack = auVar38._0_4_;
            *(int *)&BT[1].field_0x1c = auVar38._4_4_;
            BT[1].allocator = (Allocator *)auVar38._8_8_;
            BT[1].dims = auVar42._0_4_;
            BT[1].w = auVar42._4_4_;
            BT[1].h = auVar42._8_4_;
            BT[1].d = auVar42._12_4_;
            *(undefined1 (*) [32])&BT[1].c = auVar11;
            BT[2].elemsize = auVar17._0_8_;
            BT[2].elempack = auVar17._8_4_;
            *(int *)&BT[2].field_0x1c = auVar17._12_4_;
            BT[2].allocator = (Allocator *)auVar17._16_8_;
            BT[2].dims = auVar17._24_4_;
            BT[2].w = auVar17._28_4_;
            *(undefined1 (*) [32])&BT[2].h = auVar9;
            BT[3].refcount = (int *)auVar8._0_8_;
            BT[3].elemsize = auVar8._8_8_;
            BT[3].elempack = auVar8._16_4_;
            *(int *)&BT[3].field_0x1c = auVar8._20_4_;
            BT[3].allocator = (Allocator *)auVar8._24_8_;
            BT = (Mat *)&BT[3].dims;
            pauVar36 = (undefined1 (*) [32])(*pauVar36 + (long)(iVar2 * 8) * 4);
            iVar23 = iVar23 + 8;
          } while (iVar23 < max_kk);
          goto LAB_004c83d4;
        }
      }
      else {
LAB_004c83d4:
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004c84db;
          pauVar24 = (undefined1 (*) [16])((long)B->data + lVar34);
          iVar23 = 3;
          do {
            auVar39 = vunpcklps_avx(pauVar24[-7],pauVar24[-6]);
            auVar42 = vunpcklps_avx(pauVar24[-5],pauVar24[-4]);
            auVar40 = vunpckhps_avx(pauVar24[-7],pauVar24[-6]);
            auVar41 = vunpckhps_avx(pauVar24[-5],pauVar24[-4]);
            auVar38 = vmovlhps_avx(auVar39,auVar42);
            auVar42 = vunpckhpd_avx(auVar39,auVar42);
            auVar39 = vmovlhps_avx(auVar40,auVar41);
            auVar44 = vunpckhpd_avx(auVar40,auVar41);
            auVar41 = vunpcklps_avx(pauVar24[-3],pauVar24[-2]);
            auVar46 = vunpcklps_avx(pauVar24[-1],*pauVar24);
            auVar4 = vunpckhps_avx(pauVar24[-3],pauVar24[-2]);
            auVar15 = vunpckhps_avx(pauVar24[-1],*pauVar24);
            auVar40 = vmovlhps_avx(auVar41,auVar46);
            auVar46 = vunpckhpd_avx(auVar41,auVar46);
            auVar41 = vmovlhps_avx(auVar4,auVar15);
            auVar4 = vunpckhpd_avx(auVar4,auVar15);
            BT->data = (void *)auVar38._0_8_;
            BT->refcount = (int *)auVar38._8_8_;
            BT->elemsize = auVar40._0_8_;
            BT->elempack = auVar40._8_4_;
            *(int *)&BT->field_0x1c = auVar40._12_4_;
            BT->allocator = (Allocator *)auVar42._0_8_;
            BT->dims = auVar42._8_4_;
            BT->w = auVar42._12_4_;
            BT->h = auVar46._0_4_;
            BT->d = auVar46._4_4_;
            BT->c = auVar46._8_4_;
            *(int *)&BT->field_0x3c = auVar46._12_4_;
            *(undefined1 (*) [16])&BT->cstep = auVar39;
            BT[1].refcount = (int *)auVar41._0_8_;
            BT[1].elemsize = auVar41._8_8_;
            BT[1].elempack = auVar44._0_4_;
            *(int *)&BT[1].field_0x1c = auVar44._4_4_;
            BT[1].allocator = (Allocator *)auVar44._8_8_;
            BT[1].dims = auVar4._0_4_;
            BT[1].w = auVar4._4_4_;
            BT[1].h = auVar4._8_4_;
            BT[1].d = auVar4._12_4_;
            BT = (Mat *)&BT[1].c;
            pauVar24 = (undefined1 (*) [16])(*pauVar24 + (long)(iVar2 * 4) * 4);
            iVar23 = iVar23 + 4;
          } while (iVar23 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar24 = (undefined1 (*) [16])((long)B->data + lVar32);
          iVar23 = max_kk;
          do {
            piVar21 = *(int **)(pauVar24[-1] + 8);
            BT->data = *(void **)pauVar24[-1];
            BT->refcount = piVar21;
            *(undefined1 (*) [16])&BT->elemsize = *pauVar24;
            BT = (Mat *)&BT->allocator;
            pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar30 * 4);
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
        }
      }
LAB_004c84db:
      lVar35 = lVar25 + 8;
      lVar37 = lVar37 + 0x100;
      lVar34 = lVar34 + 0x80;
      lVar32 = lVar32 + 0x20;
      bVar3 = lVar25 < lVar28 + -0xf;
      lVar25 = lVar35;
    } while (bVar3);
  }
  if ((int)((uint)lVar35 | 3) < max_jj) {
    lVar25 = (long)(iVar2 * k);
    lVar32 = (long)(int)(uint)lVar35;
    lVar34 = (lVar32 + lVar33) * 0x20 + lVar25 * 4 + 0x60;
    lVar37 = (lVar32 + lVar33) * 0x10 + lVar25 * 4 + 0x30;
    lVar25 = lVar33 * 4 + lVar32 * 4 + lVar25 * 4;
    do {
      if (iVar1 == 8) {
        if (7 < max_kk) {
          pauVar36 = (undefined1 (*) [32])((long)B->data + lVar34);
          iVar23 = 7;
          do {
            auVar17 = vunpcklps_avx(pauVar36[-3],pauVar36[-2]);
            auVar8 = vunpckhps_avx(pauVar36[-3],pauVar36[-2]);
            auVar11 = vunpcklps_avx(pauVar36[-1],*pauVar36);
            auVar9 = vunpckhps_avx(pauVar36[-1],*pauVar36);
            auVar10 = vunpcklpd_avx(auVar17,auVar11);
            auVar17 = vunpckhpd_avx(auVar17,auVar11);
            auVar11 = vunpcklpd_avx(auVar8,auVar9);
            auVar8 = vunpckhpd_avx(auVar8,auVar9);
            auVar39 = auVar17._0_16_;
            auVar40 = auVar11._0_16_;
            auVar38 = auVar8._0_16_;
            auVar17 = vperm2f128_avx(auVar10,auVar17,0x31);
            auVar8 = vperm2f128_avx(auVar11,auVar8,0x31);
            BT->data = (void *)SUB168(auVar10._0_16_,0);
            BT->refcount = (int *)SUB168(auVar10._0_16_,8);
            BT->elemsize = auVar39._0_8_;
            BT->elempack = auVar39._8_4_;
            *(int *)&BT->field_0x1c = auVar39._12_4_;
            BT->allocator = (Allocator *)auVar40._0_8_;
            BT->dims = auVar40._8_4_;
            BT->w = auVar40._12_4_;
            BT->h = auVar38._0_4_;
            BT->d = auVar38._4_4_;
            BT->c = auVar38._8_4_;
            *(int *)&BT->field_0x3c = auVar38._12_4_;
            *(undefined1 (*) [32])&BT->cstep = auVar17;
            BT[1].elempack = auVar8._0_4_;
            *(int *)&BT[1].field_0x1c = auVar8._4_4_;
            BT[1].allocator = (Allocator *)auVar8._8_8_;
            BT[1].dims = auVar8._16_4_;
            BT[1].w = auVar8._20_4_;
            BT[1].h = auVar8._24_4_;
            BT[1].d = auVar8._28_4_;
            BT = (Mat *)&BT[1].c;
            iVar23 = iVar23 + 8;
            pauVar36 = (undefined1 (*) [32])(*pauVar36 + (long)(iVar2 * 8) * 4);
          } while (iVar23 < max_kk);
          goto LAB_004c861e;
        }
      }
      else {
LAB_004c861e:
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004c86c0;
          pauVar24 = (undefined1 (*) [16])((long)B->data + lVar37);
          iVar23 = 3;
          do {
            auVar39 = vunpcklps_avx(pauVar24[-3],pauVar24[-2]);
            auVar40 = vunpcklps_avx(pauVar24[-1],*pauVar24);
            auVar41 = vunpckhps_avx(pauVar24[-3],pauVar24[-2]);
            auVar42 = vunpckhps_avx(pauVar24[-1],*pauVar24);
            auVar38 = vmovlhps_avx(auVar39,auVar40);
            auVar40 = vunpckhpd_avx(auVar39,auVar40);
            auVar39 = vmovlhps_avx(auVar41,auVar42);
            auVar41 = vunpckhpd_avx(auVar41,auVar42);
            BT->data = (void *)auVar38._0_8_;
            BT->refcount = (int *)auVar38._8_8_;
            BT->elemsize = auVar40._0_8_;
            BT->elempack = auVar40._8_4_;
            *(int *)&BT->field_0x1c = auVar40._12_4_;
            BT->allocator = (Allocator *)auVar39._0_8_;
            BT->dims = auVar39._8_4_;
            BT->w = auVar39._12_4_;
            BT->h = auVar41._0_4_;
            BT->d = auVar41._4_4_;
            BT->c = auVar41._8_4_;
            *(int *)&BT->field_0x3c = auVar41._12_4_;
            BT = (Mat *)&BT->cstep;
            iVar23 = iVar23 + 4;
            pauVar24 = (undefined1 (*) [16])(*pauVar24 + (long)(iVar2 * 4) * 4);
          } while (iVar23 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar24 = (undefined1 (*) [16])((long)B->data + lVar25);
          iVar23 = max_kk;
          do {
            *(undefined1 (*) [16])BT = *pauVar24;
            BT = (Mat *)&BT->elemsize;
            pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar30 * 4);
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
        }
      }
LAB_004c86c0:
      lVar35 = lVar32 + 4;
      lVar27 = lVar32 + 7;
      lVar34 = lVar34 + 0x80;
      lVar37 = lVar37 + 0x40;
      lVar25 = lVar25 + 0x10;
      lVar32 = lVar35;
    } while (lVar27 < lVar28);
  }
  if ((int)((uint)lVar35 | 1) < max_jj) {
    lVar34 = (long)(iVar2 * k);
    lVar25 = (long)(int)(uint)lVar35;
    lVar32 = (lVar25 + lVar33) * 0x20 + lVar34 * 4 + 0x20;
    lVar37 = (lVar25 + lVar33) * 0x10 + lVar34 * 4 + 0x10;
    lVar34 = lVar33 * 4 + lVar25 * 4 + lVar34 * 4 + 4;
    do {
      if (iVar1 == 8) {
        if (7 < max_kk) {
          pauVar36 = (undefined1 (*) [32])((long)B->data + lVar32);
          iVar23 = 7;
          do {
            auVar8 = vunpcklps_avx(pauVar36[-1],*pauVar36);
            auVar17 = vunpckhps_avx(pauVar36[-1],*pauVar36);
            auVar38 = auVar17._0_16_;
            auVar17 = vperm2f128_avx(auVar8,auVar17,0x31);
            BT->data = (void *)SUB168(auVar8._0_16_,0);
            BT->refcount = (int *)SUB168(auVar8._0_16_,8);
            BT->elemsize = auVar38._0_8_;
            BT->elempack = auVar38._8_4_;
            *(int *)&BT->field_0x1c = auVar38._12_4_;
            BT->allocator = (Allocator *)auVar17._0_8_;
            BT->dims = auVar17._8_4_;
            BT->w = auVar17._12_4_;
            BT->h = auVar17._16_4_;
            BT->d = auVar17._20_4_;
            BT->c = auVar17._24_4_;
            *(int *)&BT->field_0x3c = auVar17._28_4_;
            BT = (Mat *)&BT->cstep;
            iVar23 = iVar23 + 8;
            pauVar36 = (undefined1 (*) [32])(*pauVar36 + (long)(iVar2 * 8) * 4);
          } while (iVar23 < max_kk);
          goto LAB_004c87ca;
        }
      }
      else {
LAB_004c87ca:
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004c8845;
          pauVar24 = (undefined1 (*) [16])((long)B->data + lVar37);
          iVar23 = 3;
          do {
            auVar39 = vunpcklps_avx(pauVar24[-1],*pauVar24);
            auVar38 = vunpckhps_avx(pauVar24[-1],*pauVar24);
            BT->data = (void *)auVar39._0_8_;
            BT->refcount = (int *)auVar39._8_8_;
            BT->elemsize = auVar38._0_8_;
            BT->elempack = auVar38._8_4_;
            *(int *)&BT->field_0x1c = auVar38._12_4_;
            BT = (Mat *)&BT->allocator;
            iVar23 = iVar23 + 4;
            pauVar24 = (undefined1 (*) [16])(*pauVar24 + (long)(iVar2 * 4) * 4);
          } while (iVar23 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          puVar31 = (undefined4 *)((long)B->data + lVar34);
          iVar23 = max_kk;
          do {
            *(undefined4 *)&BT->data = puVar31[-1];
            *(undefined4 *)((long)&BT->data + 4) = *puVar31;
            BT = (Mat *)&BT->refcount;
            puVar31 = puVar31 + lVar30;
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
        }
      }
LAB_004c8845:
      lVar35 = lVar25 + 2;
      lVar27 = lVar25 + 3;
      lVar32 = lVar32 + 0x40;
      lVar37 = lVar37 + 0x20;
      lVar34 = lVar34 + 8;
      lVar25 = lVar35;
    } while (lVar27 < lVar28);
  }
  if ((int)lVar35 < max_jj) {
    lVar34 = (long)(k * iVar2);
    lVar32 = (long)(int)lVar35;
    lVar35 = (lVar32 + lVar33) * 0x20 + lVar34 * 4;
    lVar25 = (lVar32 + lVar33) * 0x10 + lVar34 * 4;
    lVar33 = lVar32 * 4 + lVar33 * 4 + lVar34 * 4;
    do {
      if (iVar1 == 8) {
        if (7 < max_kk) {
          pauVar36 = (undefined1 (*) [32])((long)B->data + lVar35);
          iVar23 = 7;
          do {
            *(undefined1 (*) [32])BT = *pauVar36;
            BT = (Mat *)&BT->allocator;
            iVar23 = iVar23 + 8;
            pauVar36 = (undefined1 (*) [32])(*pauVar36 + (long)(iVar2 * 8) * 4);
          } while (iVar23 < max_kk);
          goto LAB_004c8917;
        }
      }
      else {
LAB_004c8917:
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004c8971;
          pauVar24 = (undefined1 (*) [16])((long)B->data + lVar25);
          iVar23 = 3;
          do {
            *(undefined1 (*) [16])BT = *pauVar24;
            BT = (Mat *)&BT->elemsize;
            iVar23 = iVar23 + 4;
            pauVar24 = (undefined1 (*) [16])(*pauVar24 + (long)(iVar2 * 4) * 4);
          } while (iVar23 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          puVar31 = (undefined4 *)((long)B->data + lVar33);
          iVar23 = max_kk;
          do {
            *(undefined4 *)&BT->data = *puVar31;
            BT = (Mat *)((long)&BT->data + 4);
            puVar31 = puVar31 + lVar30;
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
        }
      }
LAB_004c8971:
      lVar32 = lVar32 + 1;
      lVar35 = lVar35 + 0x20;
      lVar25 = lVar25 + 0x10;
      lVar33 = lVar33 + 4;
    } while (lVar32 != lVar28);
  }
  return;
}

Assistant:

static void transpose_pack_B_tile(const Mat& B, Mat& BT, int batch, int max_jj, int max_kk, int nT)
{
    #pragma omp parallel for num_threads(nT)
    for (int b = 0; b < batch; b++)
    {
        float* pp = BT.row(b);

        int jj = 0;
#if __SSE2__
        for (; jj + 11 < max_jj; jj += 12)
        {
            const float* p0 = B;

            int kk = 0;
#if __AVX__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm512_storeu_ps(pp, _r0);
                _mm512_storeu_ps(pp + 16, _r1);
                _mm512_storeu_ps(pp + 16 * 2, _r2);
                _mm512_storeu_ps(pp + 16 * 3, _r3);
                _mm512_storeu_ps(pp + 16 * 4, _r4);
                _mm512_storeu_ps(pp + 16 * 5, _r5);
                _mm512_storeu_ps(pp + 16 * 6, _r6);
                _mm512_storeu_ps(pp + 16 * 7, _r7);
                _mm512_storeu_ps(pp + 16 * 8, _r8);
                _mm512_storeu_ps(pp + 16 * 9, _r9);
                _mm512_storeu_ps(pp + 16 * 10, _ra);
                _mm512_storeu_ps(pp + 16 * 11, _rb);
                p0 += max_jj * batch * 16;
                pp += 192;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                _mm256_storeu_ps(pp + 8 * 8, _r8);
                _mm256_storeu_ps(pp + 8 * 9, _r9);
                _mm256_storeu_ps(pp + 8 * 10, _ra);
                _mm256_storeu_ps(pp + 8 * 11, _rb);
                p0 += max_jj * batch * 8;
                pp += 96;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __AVX__
            p0 += (b * max_jj + jj) * 4;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                p0 += max_jj * batch * 4;
                pp += 48;
            }
            p0 -= (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[2];
                pp[2] = p0[2 * 2];
                pp[3] = p0[3 * 2];
                pp[4] = p0[4 * 2];
                pp[5] = p0[5 * 2];
                pp[6] = p0[6 * 2];
                pp[7] = p0[7 * 2];
                pp[8] = p0[8 * 2];
                pp[9] = p0[9 * 2];
                pp[10] = p0[10 * 2];
                pp[11] = p0[11 * 2];
                pp[12] = p0[1];
                pp[13] = p0[2 + 1];
                pp[14] = p0[2 * 2 + 1];
                pp[15] = p0[3 * 2 + 1];
                pp[16] = p0[4 * 2 + 1];
                pp[17] = p0[5 * 2 + 1];
                pp[18] = p0[6 * 2 + 1];
                pp[19] = p0[7 * 2 + 1];
                pp[20] = p0[8 * 2 + 1];
                pp[21] = p0[9 * 2 + 1];
                pp[22] = p0[10 * 2 + 1];
                pp[23] = p0[11 * 2 + 1];
                p0 += max_jj * batch * 2;
                pp += 24;
            }
            p0 -= (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                pp[4] = p0[4];
                pp[5] = p0[5];
                pp[6] = p0[6];
                pp[7] = p0[7];
                pp[8] = p0[8];
                pp[9] = p0[9];
                pp[10] = p0[10];
                pp[11] = p0[11];
                p0 += max_jj * batch;
                pp += 12;
            }
        }
        for (; jj + 7 < max_jj; jj += 8)
        {
            const float* p0 = B;

            int kk = 0;
#if __AVX__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_storeu_ps(pp, _r0);
                _mm512_storeu_ps(pp + 16, _r1);
                _mm512_storeu_ps(pp + 16 * 2, _r2);
                _mm512_storeu_ps(pp + 16 * 3, _r3);
                _mm512_storeu_ps(pp + 16 * 4, _r4);
                _mm512_storeu_ps(pp + 16 * 5, _r5);
                _mm512_storeu_ps(pp + 16 * 6, _r6);
                _mm512_storeu_ps(pp + 16 * 7, _r7);
                p0 += max_jj * batch * 16;
                pp += 128;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                p0 += max_jj * batch * 8;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __AVX__
            p0 += (b * max_jj + jj) * 4;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 8, _r1);
                _mm_store_ps(pp + 12, _r5);
                _mm_store_ps(pp + 16, _r2);
                _mm_store_ps(pp + 20, _r6);
                _mm_store_ps(pp + 24, _r3);
                _mm_store_ps(pp + 28, _r7);
                p0 += max_jj * batch * 4;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 4;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[2];
                pp[2] = p0[4];
                pp[3] = p0[6];
                pp[4] = p0[8];
                pp[5] = p0[10];
                pp[6] = p0[12];
                pp[7] = p0[14];
                pp[8] = p0[1];
                pp[9] = p0[3];
                pp[10] = p0[5];
                pp[11] = p0[7];
                pp[12] = p0[9];
                pp[13] = p0[11];
                pp[14] = p0[13];
                pp[15] = p0[15];
                p0 += max_jj * batch * 2;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                pp[4] = p0[4];
                pp[5] = p0[5];
                pp[6] = p0[6];
                pp[7] = p0[7];
                p0 += max_jj * batch;
                pp += 8;
            }
        }
        for (; jj + 3 < max_jj; jj += 4)
        {
            const float* p0 = B;

            int kk = 0;
#if __AVX__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_storeu_ps(pp, _r0);
                _mm512_storeu_ps(pp + 16, _r1);
                _mm512_storeu_ps(pp + 32, _r2);
                _mm512_storeu_ps(pp + 48, _r3);
                p0 += max_jj * batch * 16;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                p0 += max_jj * batch * 8;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __AVX__
            p0 += (b * max_jj + jj) * 4;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                p0 += max_jj * batch * 4;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 4;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[2];
                pp[2] = p0[4];
                pp[3] = p0[6];
                pp[4] = p0[1];
                pp[5] = p0[3];
                pp[6] = p0[5];
                pp[7] = p0[7];
                p0 += max_jj * batch * 2;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                p0 += max_jj * batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; jj + 1 < max_jj; jj += 2)
        {
            const float* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_storeu_ps(pp, _r0);
                _mm512_storeu_ps(pp + 16, _r1);
                p0 += max_jj * batch * 16;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                p0 += max_jj * batch * 8;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __AVX__
            p0 += (b * max_jj + jj) * 4;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_storeu_ps(pp, _tmp0);
                _mm_storeu_ps(pp + 4, _tmp1);
                p0 += max_jj * batch * 4;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 4;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[2];
                pp[2] = p0[1];
                pp[3] = p0[3];
                p0 += max_jj * batch * 2;
                pp += 4;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch;
                pp += 2;
            }
        }
        for (; jj < max_jj; jj++)
        {
            const float* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                _mm512_storeu_ps(pp, _r0);
                p0 += max_jj * batch * 16;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                _mm256_storeu_ps(pp, _r0);
                p0 += max_jj * batch * 8;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __AVX__
            p0 += (b * max_jj + jj) * 4;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                _mm_storeu_ps(pp, _r0);
                p0 += max_jj * batch * 4;
                pp += 4;
            }
            p0 -= (b * max_jj + jj) * 4;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch * 2;
                pp += 2;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += max_jj * batch;
                pp += 1;
            }
        }
    }
}